

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::SymbolTable::SymbolTable(SymbolTable *this,string *framework_name)

{
  string *framework_name_local;
  SymbolTable *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)framework_name);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->top_names_);
  std::
  vector<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>,_std::allocator<std::unique_ptr<hgdb::json::Module,_std::default_delete<hgdb::json::Module>_>_>_>
  ::vector(&this->modules_);
  std::vector<hgdb::json::Variable,_std::allocator<hgdb::json::Variable>_>::vector
            (&this->variables_);
  this->reorder_ = true;
  return;
}

Assistant:

explicit SymbolTable(std::string framework_name) : framework_name_(std::move(framework_name)) {}